

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall BindRnase::Execute(BindRnase *this)

{
  element_type *peVar1;
  SpeciesTracker *this_00;
  undefined1 local_70 [64];
  undefined1 local_30 [8];
  shared_ptr<Rnase> new_pol;
  Ptr polymer;
  BindRnase *this_local;
  
  Bind::ChoosePolymer((Bind *)&new_pol.super___shared_ptr<Rnase,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
  std::make_shared<Rnase,Rnase_const&>((Rnase *)local_30);
  peVar1 = std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &new_pol.super___shared_ptr<Rnase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<MobileElement>::shared_ptr<Rnase,void>
            ((shared_ptr<MobileElement> *)(local_70 + 0x20),(shared_ptr<Rnase> *)local_30);
  (*peVar1->_vptr_Polymer[1])
            (peVar1,(shared_ptr<MobileElement> *)(local_70 + 0x20),
             &(this->super_Bind).promoter_name_);
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)(local_70 + 0x20));
  this_00 = SpeciesTracker::Instance();
  std::__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Polymer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &new_pol.super___shared_ptr<Rnase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Polymer::wrapper((Polymer *)local_70);
  std::shared_ptr<Reaction>::shared_ptr<PolymerWrapper,void>
            ((shared_ptr<Reaction> *)(local_70 + 0x10),(shared_ptr<PolymerWrapper> *)local_70);
  Signal<std::shared_ptr<Reaction>_>::Emit
            (&this_00->propensity_signal_,(shared_ptr<Reaction> *)(local_70 + 0x10));
  std::shared_ptr<Reaction>::~shared_ptr((shared_ptr<Reaction> *)(local_70 + 0x10));
  std::shared_ptr<PolymerWrapper>::~shared_ptr((shared_ptr<PolymerWrapper> *)local_70);
  std::shared_ptr<Rnase>::~shared_ptr((shared_ptr<Rnase> *)local_30);
  std::shared_ptr<Polymer>::~shared_ptr
            ((shared_ptr<Polymer> *)
             &new_pol.super___shared_ptr<Rnase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void BindRnase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Rnase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
}